

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O0

int tcv_get_tx_cur(tcv_t *tcv,uint16_t *cur)

{
  _Bool _Var1;
  int local_24;
  int ret;
  uint16_t *cur_local;
  tcv_t *tcv_local;
  
  local_24 = -0xc;
  _Var1 = tcv_check_and_lock_ok(tcv);
  if ((_Var1) && (cur != (uint16_t *)0x0)) {
    if (tcv->fun->get_tx_cur != (_func_int_tcv_t_ptr_uint16_t_ptr *)0x0) {
      local_24 = (*tcv->fun->get_tx_cur)(tcv,cur);
    }
    tcv_unlock(tcv);
    tcv_local._4_4_ = local_24;
  }
  else {
    tcv_local._4_4_ = -4;
  }
  return tcv_local._4_4_;
}

Assistant:

int tcv_get_tx_cur(tcv_t* tcv, uint16_t* cur)
{
	/* Not all have Digital diagnostics */
	int ret = TCV_ERR_FEATURE_NOT_AVAILABLE;

	if (!tcv_check_and_lock_ok(tcv) || !cur)
		return TCV_ERR_INVALID_ARG;

	if (tcv->fun->get_tx_cur)
		ret = tcv->fun->get_tx_cur(tcv, cur);

	tcv_unlock(tcv);
	return ret;
}